

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O3

StringRef __thiscall
llvm::sys::detail::getHostCPUNameForPowerPC(detail *this,StringRef ProcCpuinfoContent)

{
  detail dVar1;
  detail *pdVar2;
  detail *pdVar3;
  char *pcVar4;
  size_t sVar5;
  detail *pdVar6;
  char *__s;
  detail *pdVar7;
  detail *pdVar8;
  StringRef SVar9;
  
  sVar5 = 7;
  __s = "generic";
  if (0 < (long)ProcCpuinfoContent.Data) {
    pdVar7 = (detail *)(ProcCpuinfoContent.Data + (long)this);
    do {
      pdVar3 = this + (*this == (detail)0xa);
      pdVar8 = pdVar3;
      if ((((pdVar3 < pdVar7) && (*pdVar3 == (detail)0x63)) &&
          (pdVar8 = pdVar3 + 1, pdVar8 < pdVar7)) &&
         (((*pdVar8 == (detail)0x70 && (pdVar8 = pdVar3 + 2, pdVar8 < pdVar7)) &&
          ((*pdVar8 == (detail)0x75 && (pdVar8 = pdVar3 + 3, pdVar8 < pdVar7)))))) {
        pdVar3 = this + (ulong)(*this == (detail)0xa) + 4;
        do {
          dVar1 = *pdVar8;
          if ((dVar1 != (detail)0x9) && (dVar1 != (detail)0x20)) {
            pdVar2 = pdVar8;
            if (dVar1 == (detail)0x3a) goto LAB_00184123;
            break;
          }
          pdVar8 = pdVar8 + 1;
          pdVar3 = pdVar3 + 1;
        } while (pdVar8 < pdVar7);
      }
LAB_001840ff:
      for (; (pdVar8 < pdVar7 && (*pdVar8 != (detail)0xa)); pdVar8 = pdVar8 + 1) {
      }
      this = pdVar8;
    } while (pdVar8 < pdVar7);
  }
  goto LAB_00184348;
LAB_00184123:
  pdVar8 = pdVar2 + 1;
  if (pdVar7 <= pdVar8) goto LAB_001840ff;
  dVar1 = *pdVar8;
  if ((dVar1 != (detail)0x9) && (dVar1 != (detail)0x20)) {
    pdVar6 = pdVar8;
    if (pdVar7 <= pdVar8) goto LAB_00184173;
    pdVar6 = pdVar2 + 2;
    goto LAB_00184153;
  }
  pdVar3 = pdVar3 + 1;
  pdVar2 = pdVar8;
  goto LAB_00184123;
LAB_00184153:
  if (((byte)dVar1 < 0x2d) && ((0x100100000600U >> ((ulong)(byte)dVar1 & 0x3f) & 1) != 0)) {
    pdVar6 = pdVar6 + -1;
    goto LAB_00184173;
  }
  if (pdVar7 <= pdVar6) goto LAB_00184173;
  dVar1 = *pdVar6;
  pdVar6 = pdVar6 + 1;
  goto LAB_00184153;
LAB_00184173:
  pcVar4 = "generic";
  switch((long)pdVar6 - (long)pdVar3) {
  case 2:
    if (*(short *)pdVar8 == 0x3447) {
      __s = "g4";
    }
    else if (*(short *)pdVar8 == 0x3547) {
LAB_00184356:
      __s = "g5";
    }
    else {
      if (*(short *)pdVar8 != 0x3241) goto switchD_00184199_caseD_5;
      __s = "a2";
    }
    break;
  case 3:
    if (pdVar2[3] != (detail)0x34 || *(short *)pdVar8 != 0x3036) goto switchD_00184199_caseD_5;
    __s = "604";
    break;
  case 4:
    if (*(int *)pdVar8 == 0x65343036) {
      __s = "604e";
    }
    else {
      __s = "7400";
      if (((*(int *)pdVar8 != 0x30303437) && (*(int *)pdVar8 != 0x30313437)) &&
         (*(int *)pdVar8 != 0x37343437)) {
        if (*(int *)pdVar8 != 0x35353437) goto switchD_00184199_caseD_5;
        __s = "7450";
      }
    }
    break;
  case 6:
    if (*(short *)(pdVar2 + 5) == 0x3452 && *(int *)pdVar8 == 0x45574f50) {
      __s = "970";
    }
    else {
      if (*(short *)(pdVar2 + 5) == 0x3552 && *(int *)pdVar8 == 0x45574f50) goto LAB_00184356;
      if (*(short *)(pdVar2 + 5) == 0x3652 && *(int *)pdVar8 == 0x45574f50) {
        __s = "pwr6";
      }
      else {
        if (*(short *)(pdVar2 + 5) != 0x3752 || *(int *)pdVar8 != 0x45574f50) {
          if (*(short *)(pdVar2 + 5) == 0x3852 && *(int *)pdVar8 == 0x45574f50) goto LAB_0018434d;
          pcVar4 = "generic";
          if (*(short *)(pdVar2 + 5) == 0x3952 && *(int *)pdVar8 == 0x45574f50) {
            pcVar4 = "pwr9";
          }
          goto switchD_00184199_caseD_5;
        }
        __s = "pwr7";
      }
    }
    break;
  case 7:
    if (*(int *)(pdVar2 + 4) != 0x45385245 || *(int *)pdVar8 != 0x45574f50)
    goto switchD_00184199_caseD_5;
LAB_0018434d:
    __s = "pwr8";
    break;
  case 8:
    __s = "970";
    if ((*(long *)pdVar8 != 0x5846303739435050) && (*(long *)pdVar8 != 0x504d303739435050))
    goto switchD_00184199_caseD_5;
    break;
  case 9:
    if (pdVar2[9] == (detail)0x4c && *(long *)pdVar8 == 0x564e385245574f50) goto LAB_0018434d;
  default:
switchD_00184199_caseD_5:
    __s = pcVar4;
  }
  sVar5 = strlen(__s);
LAB_00184348:
  SVar9.Length = sVar5;
  SVar9.Data = __s;
  return SVar9;
}

Assistant:

StringRef sys::detail::getHostCPUNameForPowerPC(StringRef ProcCpuinfoContent) {
  // Access to the Processor Version Register (PVR) on PowerPC is privileged,
  // and so we must use an operating-system interface to determine the current
  // processor type. On Linux, this is exposed through the /proc/cpuinfo file.
  const char *generic = "generic";

  // The cpu line is second (after the 'processor: 0' line), so if this
  // buffer is too small then something has changed (or is wrong).
  StringRef::const_iterator CPUInfoStart = ProcCpuinfoContent.begin();
  StringRef::const_iterator CPUInfoEnd = ProcCpuinfoContent.end();

  StringRef::const_iterator CIP = CPUInfoStart;

  StringRef::const_iterator CPUStart = 0;
  size_t CPULen = 0;

  // We need to find the first line which starts with cpu, spaces, and a colon.
  // After the colon, there may be some additional spaces and then the cpu type.
  while (CIP < CPUInfoEnd && CPUStart == 0) {
    if (CIP < CPUInfoEnd && *CIP == '\n')
      ++CIP;

    if (CIP < CPUInfoEnd && *CIP == 'c') {
      ++CIP;
      if (CIP < CPUInfoEnd && *CIP == 'p') {
        ++CIP;
        if (CIP < CPUInfoEnd && *CIP == 'u') {
          ++CIP;
          while (CIP < CPUInfoEnd && (*CIP == ' ' || *CIP == '\t'))
            ++CIP;

          if (CIP < CPUInfoEnd && *CIP == ':') {
            ++CIP;
            while (CIP < CPUInfoEnd && (*CIP == ' ' || *CIP == '\t'))
              ++CIP;

            if (CIP < CPUInfoEnd) {
              CPUStart = CIP;
              while (CIP < CPUInfoEnd && (*CIP != ' ' && *CIP != '\t' &&
                                          *CIP != ',' && *CIP != '\n'))
                ++CIP;
              CPULen = CIP - CPUStart;
            }
          }
        }
      }
    }

    if (CPUStart == 0)
      while (CIP < CPUInfoEnd && *CIP != '\n')
        ++CIP;
  }

  if (CPUStart == 0)
    return generic;

  return StringSwitch<const char *>(StringRef(CPUStart, CPULen))
      .Case("604e", "604e")
      .Case("604", "604")
      .Case("7400", "7400")
      .Case("7410", "7400")
      .Case("7447", "7400")
      .Case("7455", "7450")
      .Case("G4", "g4")
      .Case("POWER4", "970")
      .Case("PPC970FX", "970")
      .Case("PPC970MP", "970")
      .Case("G5", "g5")
      .Case("POWER5", "g5")
      .Case("A2", "a2")
      .Case("POWER6", "pwr6")
      .Case("POWER7", "pwr7")
      .Case("POWER8", "pwr8")
      .Case("POWER8E", "pwr8")
      .Case("POWER8NVL", "pwr8")
      .Case("POWER9", "pwr9")
      .Default(generic);
}